

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
* __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
::insert(Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
         *this,pair<unsigned_long,_signed_char> *value)

{
  pointer pNVar1;
  pointer pNVar2;
  size_t sVar3;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *pNVar4;
  size_t sVar5;
  size_t sVar6;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *pNVar7;
  ulong uVar8;
  size_t *psVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  
  if (value->second < (this->_value).second) {
    return (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
            *)0x0;
  }
  pNVar1 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar2 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)pNVar1 - (long)pNVar2 >> 4;
  uVar13 = lVar12 - 1;
  if (pNVar1 != pNVar2) {
    lVar12 = lVar12 << 4;
    do {
      pNVar7 = *(Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                 **)((long)&(this->_nodeRefs)._nodes.
                            super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].pNode + lVar12);
      if ((pNVar7 != (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                      *)0x0) &&
         (pNVar7 = insert(pNVar7,value),
         pNVar7 != (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                    *)0x0)) goto LAB_018fd63f;
      bVar14 = uVar13 != 0;
      uVar13 = uVar13 - 1;
      lVar12 = lVar12 + -0x10;
    } while (bVar14);
    uVar13 = 0xffffffffffffffff;
  }
  pNVar7 = (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
            *)0x0;
LAB_018fd63f:
  if (pNVar7 == (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                 *)0x0) {
    pNVar7 = _Pool::Allocate(this->_pool,value);
    uVar13 = 0;
  }
  uVar8 = (pNVar7->_nodeRefs)._swapLevel;
  pNVar1 = (pNVar7->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(pNVar7->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4;
  if (uVar8 < uVar10) {
    if (uVar13 < uVar8) {
      psVar9 = &pNVar1[uVar8].width;
      *psVar9 = *psVar9 + (this->_nodeRefs)._nodes.
                          super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar13].width;
      uVar13 = uVar13 + 1;
    }
    uVar8 = (long)(this->_nodeRefs)._nodes.
                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_nodeRefs)._nodes.
                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    if (uVar10 < uVar8) {
      uVar8 = uVar10;
    }
    if (uVar13 < uVar8) {
      uVar10 = uVar13 << 4 | 8;
      do {
        pNVar1 = (pNVar7->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar2 = (this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(long *)((long)&pNVar2->pNode + uVar10) =
             (*(long *)((long)&pNVar2->pNode + uVar10) - *(long *)((long)&pNVar1->pNode + uVar10)) +
             1;
        sVar3 = (pNVar7->_nodeRefs)._swapLevel;
        pNVar4 = pNVar2[sVar3].pNode;
        sVar5 = pNVar2[sVar3].width;
        pNVar1 = pNVar1 + sVar3;
        sVar6 = pNVar1->width;
        pNVar2[sVar3].pNode = pNVar1->pNode;
        pNVar2[sVar3].width = sVar6;
        pNVar1 = (pNVar7->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (pNVar7->_nodeRefs)._swapLevel;
        pNVar1->pNode = pNVar4;
        pNVar1->width = sVar5;
        uVar11 = (pNVar7->_nodeRefs)._swapLevel + 1;
        (pNVar7->_nodeRefs)._swapLevel = uVar11;
        pNVar1 = (pNVar7->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar11 < (ulong)((long)(pNVar7->_nodeRefs)._nodes.
                                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4))
        {
          pNVar1[uVar11].width =
               *(size_t *)
                ((long)&((this->_nodeRefs)._nodes.
                         super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->pNode + uVar10);
        }
        uVar13 = uVar13 + 1;
        uVar10 = uVar10 + 0x10;
      } while (uVar8 != uVar13);
    }
    if ((ulong)((long)(pNVar7->_nodeRefs)._nodes.
                      super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pNVar7->_nodeRefs)._nodes.
                      super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <=
        (pNVar7->_nodeRefs)._swapLevel) {
      pNVar1 = (this->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(this->_nodeRefs)._nodes.
                    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4;
      lVar12 = uVar8 - uVar13;
      pNVar7 = this;
      if (uVar13 <= uVar8 && lVar12 != 0) {
        psVar9 = &pNVar1[uVar13].width;
        do {
          *psVar9 = *psVar9 + 1;
          psVar9 = psVar9 + 2;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
    }
  }
  else {
    pNVar1 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = (long)(this->_nodeRefs)._nodes.
                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4;
    lVar12 = uVar13 - uVar10;
    pNVar7 = this;
    if (uVar10 <= uVar13 && lVar12 != 0) {
      psVar9 = &pNVar1[uVar10].width;
      do {
        *psVar9 = *psVar9 + 1;
        psVar9 = psVar9 + 2;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
  }
  return pNVar7;
}

Assistant:

inline bool operator()(const T &lhi, const T &rhi) const {
		return lhi.second < rhi.second;
	}